

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsRecord.cpp
# Opt level: O0

void __thiscall xmrig::DnsRecord::DnsRecord(DnsRecord *this,addrinfo *addr)

{
  int iVar1;
  long in_RSI;
  int *in_RDI;
  char *buf;
  char *in_stack_ffffffffffffffb8;
  String *in_stack_ffffffffffffffc0;
  
  iVar1 = 1;
  if (*(int *)(in_RSI + 4) == 10) {
    iVar1 = 2;
  }
  *in_RDI = iVar1;
  String::String((String *)(in_RDI + 2));
  if (*in_RDI == 2) {
    in_stack_ffffffffffffffc0 = (String *)operator_new__(0x2d);
    *(undefined8 *)((long)&in_stack_ffffffffffffffc0[1].m_size + 5) = 0;
    *(undefined8 *)((long)&in_stack_ffffffffffffffc0[2].m_data + 5) = 0;
    in_stack_ffffffffffffffc0[1].m_data = (char *)0x0;
    in_stack_ffffffffffffffc0[1].m_size = 0;
    in_stack_ffffffffffffffc0->m_data = (char *)0x0;
    in_stack_ffffffffffffffc0->m_size = 0;
    uv_ip6_name(*(undefined8 *)(in_RSI + 0x18),in_stack_ffffffffffffffc0,0x2d);
  }
  else {
    in_stack_ffffffffffffffb8 = (char *)operator_new__(0x10);
    in_stack_ffffffffffffffb8[0] = '\0';
    in_stack_ffffffffffffffb8[1] = '\0';
    in_stack_ffffffffffffffb8[2] = '\0';
    in_stack_ffffffffffffffb8[3] = '\0';
    in_stack_ffffffffffffffb8[4] = '\0';
    in_stack_ffffffffffffffb8[5] = '\0';
    in_stack_ffffffffffffffb8[6] = '\0';
    in_stack_ffffffffffffffb8[7] = '\0';
    in_stack_ffffffffffffffb8[8] = '\0';
    in_stack_ffffffffffffffb8[9] = '\0';
    in_stack_ffffffffffffffb8[10] = '\0';
    in_stack_ffffffffffffffb8[0xb] = '\0';
    in_stack_ffffffffffffffb8[0xc] = '\0';
    in_stack_ffffffffffffffb8[0xd] = '\0';
    in_stack_ffffffffffffffb8[0xe] = '\0';
    in_stack_ffffffffffffffb8[0xf] = '\0';
    uv_ip4_name(*(undefined8 *)(in_RSI + 0x18),in_stack_ffffffffffffffb8,0x10);
  }
  String::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

xmrig::DnsRecord::DnsRecord(const addrinfo *addr) :
    m_type(addr->ai_family == AF_INET6 ? AAAA : A)
{
    char *buf = nullptr;

    if (m_type == AAAA) {
        buf = new char[45]();
        uv_ip6_name(reinterpret_cast<sockaddr_in6*>(addr->ai_addr), buf, 45);
    }
    else {
        buf = new char[16]();
        uv_ip4_name(reinterpret_cast<sockaddr_in*>(addr->ai_addr), buf, 16);
    }

    m_ip = buf;
}